

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O0

FeatureDescriptor * __thiscall
cmComputeLinkInformation::GetGroupFeature(cmComputeLinkInformation *this,string *feature)

{
  cmMakefile *pcVar1;
  cmake *pcVar2;
  iterator iVar3;
  bool bVar4;
  string *psVar5;
  pointer ppVar6;
  size_type sVar7;
  reference pvVar8;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>,_bool>
  pVar9;
  FeatureDescriptor local_518;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>
  local_468;
  undefined1 local_460;
  undefined1 local_458 [16];
  string local_448;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_428;
  string local_418;
  string local_3f8;
  string local_3d8;
  GroupFeatureDescriptor local_3b8;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>
  local_310;
  undefined1 local_308;
  undefined1 local_300 [24];
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  items;
  undefined1 local_2c8 [48];
  size_type local_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  aStack_290;
  _Base_ptr p_Stack_280;
  _Base_ptr local_278;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  aStack_270;
  _Base_ptr p_Stack_260;
  _Base_ptr local_258;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  aStack_250;
  _Base_ptr p_Stack_240;
  size_type local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  aStack_230;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>
  local_218;
  undefined1 local_210 [8];
  undefined1 local_208 [16];
  string local_1f8;
  undefined1 local_1d8 [8];
  cmValue langFeature;
  _Base_ptr local_1b8;
  _Base_ptr p_Stack_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_1a8;
  _Base_ptr local_198;
  _Base_ptr p_Stack_190;
  _Base_ptr local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  aStack_180;
  size_t sStack_170;
  undefined1 local_168 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_158;
  _Base_ptr local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  aStack_140;
  _Base_ptr p_Stack_130;
  _Base_ptr local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  aStack_120;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>
  local_110;
  undefined1 local_108 [8];
  undefined1 local_100 [16];
  string local_f0;
  string local_d0;
  _Base_ptr local_b0;
  string local_a8;
  string local_78;
  cmValue local_58;
  cmValue featureSupported;
  string featureName;
  _Self local_28;
  iterator it;
  string *feature_local;
  cmComputeLinkInformation *this_local;
  
  it._M_node = (_Base_ptr)feature;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>_>
       ::find(&this->GroupFeatureDescriptors,feature);
  featureName.field_2._8_8_ =
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>_>
       ::end(&this->GroupFeatureDescriptors);
  bVar4 = std::operator!=(&local_28,(_Self *)((long)&featureName.field_2 + 8));
  if (bVar4) {
    ppVar6 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>
             ::operator->(&local_28);
    this_local = (cmComputeLinkInformation *)&ppVar6->second;
  }
  else {
    cmStrCat<char_const(&)[7],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&>
              ((string *)&featureSupported,(char (*) [7])0x112a736,&this->LinkLanguage,
               (char (*) [19])0x11589f5,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)it._M_node);
    pcVar1 = this->Makefile;
    cmStrCat<std::__cxx11::string&,char_const(&)[11]>
              (&local_78,(string *)&featureSupported,(char (*) [11])0x1170375);
    local_58 = cmMakefile::GetDefinition(pcVar1,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    bVar4 = cmValue::operator_cast_to_bool(&local_58);
    if (!bVar4) {
      cmStrCat<char_const(&)[24],std::__cxx11::string_const&>
                (&local_a8,(char (*) [24])"CMAKE_LINK_GROUP_USING_",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)it._M_node);
      std::__cxx11::string::operator=((string *)&featureSupported,(string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
      pcVar1 = this->Makefile;
      cmStrCat<std::__cxx11::string&,char_const(&)[11]>
                (&local_d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &featureSupported,(char (*) [11])0x1170375);
      local_b0 = (_Base_ptr)cmMakefile::GetDefinition(pcVar1,&local_d0);
      local_58 = (cmValue)local_b0;
      std::__cxx11::string::~string((string *)&local_d0);
    }
    bVar4 = cmValue::IsOn(&local_58);
    iVar3 = it;
    if (bVar4) {
      local_1d8 = (undefined1  [8])
                  cmMakefile::GetDefinition(this->Makefile,(string *)&featureSupported);
      bVar4 = cmValue::operator_cast_to_bool((cmValue *)local_1d8);
      iVar3 = it;
      if (bVar4) {
        psVar5 = cmValue::operator*[abi_cxx11_((cmValue *)local_1d8);
        cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_300);
        cmExpandListWithBacktrace
                  ((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)(local_300 + 0x10),psVar5,(cmListFileBacktrace *)local_300,Yes);
        cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_300);
        cmGeneratorTarget::ResolveLinkerWrapper
                  (this->Target,
                   (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)(local_300 + 0x10),&this->LinkLanguage,true);
        sVar7 = std::
                vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::size((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)(local_300 + 0x10));
        iVar3 = it;
        if (sVar7 == 2) {
          std::__cxx11::string::string((string *)&local_3d8,(string *)it._M_node);
          pvVar8 = std::
                   vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)(local_300 + 0x10),0);
          std::__cxx11::string::string((string *)&local_3f8,(string *)pvVar8);
          pvVar8 = std::
                   vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)(local_300 + 0x10),1);
          std::__cxx11::string::string((string *)&local_418,(string *)pvVar8);
          GroupFeatureDescriptor::GroupFeatureDescriptor
                    (&local_3b8,&local_3d8,&local_3f8,&local_418);
          pVar9 = std::
                  map<std::__cxx11::string,cmComputeLinkInformation::FeatureDescriptor,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
                  ::
                  emplace<std::__cxx11::string_const&,cmComputeLinkInformation::GroupFeatureDescriptor>
                            ((map<std::__cxx11::string,cmComputeLinkInformation::FeatureDescriptor,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
                              *)&this->GroupFeatureDescriptors,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             iVar3._M_node,&local_3b8);
          local_428._M_allocated_capacity = (size_type)pVar9.first._M_node;
          local_428._M_local_buf[8] = pVar9.second;
          local_310._M_node = (_Base_ptr)local_428._M_allocated_capacity;
          local_308 = local_428._M_local_buf[8];
          ppVar6 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>
                   ::operator->(&local_310);
          GroupFeatureDescriptor::~GroupFeatureDescriptor(&local_3b8);
          std::__cxx11::string::~string((string *)&local_418);
          std::__cxx11::string::~string((string *)&local_3f8);
          std::__cxx11::string::~string((string *)&local_3d8);
        }
        else {
          pcVar2 = this->CMakeInstance;
          psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
          cmStrCat<char_const(&)[10],std::__cxx11::string_const&,char_const(&)[27],std::__cxx11::string&,char_const(&)[79],std::__cxx11::string_const&,char_const(&)[3]>
                    ((string *)(local_458 + 0x10),(char (*) [10])"Feature \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     iVar3._M_node,(char (*) [27])"\', specified by variable \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &featureSupported,
                     (char (*) [79])
                     "\', is malformed (wrong number of elements) and cannot be used to link target \'"
                     ,psVar5,(char (*) [3])0x112ff16);
          cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_458);
          cmake::IssueMessage(pcVar2,FATAL_ERROR,(string *)(local_458 + 0x10),
                              (cmListFileBacktrace *)local_458);
          cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_458);
          std::__cxx11::string::~string((string *)(local_458 + 0x10));
          iVar3 = it;
          local_518.ItemNameFormat._M_string_length = 0;
          local_518.ItemNameFormat.field_2._M_allocated_capacity = 0;
          local_518.ItemPathFormat.field_2._8_8_ = 0;
          local_518.ItemNameFormat._M_dataplus = (_Alloc_hider)0x0;
          local_518.ItemNameFormat._1_7_ = 0;
          local_518.ItemPathFormat._M_string_length = 0;
          local_518.ItemPathFormat.field_2._M_allocated_capacity = 0;
          local_518.Suffix.field_2._8_8_ = 0;
          local_518.ItemPathFormat._M_dataplus = (_Alloc_hider)0x0;
          local_518.ItemPathFormat._1_7_ = 0;
          local_518.Suffix._M_string_length = 0;
          local_518.Suffix.field_2._M_allocated_capacity = 0;
          local_518.Prefix.field_2._8_8_ = 0;
          local_518.Suffix._M_dataplus = (_Alloc_hider)0x0;
          local_518.Suffix._1_7_ = 0;
          local_518.Prefix._M_string_length = 0;
          local_518.Prefix.field_2._M_allocated_capacity = 0;
          local_518.Supported = false;
          local_518._33_7_ = 0;
          local_518.Prefix._M_dataplus = (_Alloc_hider)0x0;
          local_518.Prefix._1_7_ = 0;
          local_518.Name.field_2._M_allocated_capacity = 0;
          local_518.Name.field_2._8_8_ = 0;
          local_518.Name._M_dataplus = (_Alloc_hider)0x0;
          local_518.Name._1_7_ = 0;
          local_518.Name._M_string_length = 0;
          local_518.ItemNameFormat.field_2._8_8_ = 0;
          FeatureDescriptor::FeatureDescriptor(&local_518);
          pVar9 = std::
                  map<std::__cxx11::string,cmComputeLinkInformation::FeatureDescriptor,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
                  ::emplace<std::__cxx11::string_const&,cmComputeLinkInformation::FeatureDescriptor>
                            ((map<std::__cxx11::string,cmComputeLinkInformation::FeatureDescriptor,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
                              *)&this->GroupFeatureDescriptors,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             iVar3._M_node,&local_518);
          local_468 = pVar9.first._M_node;
          local_460 = pVar9.second;
          ppVar6 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>
                   ::operator->(&local_468);
          FeatureDescriptor::~FeatureDescriptor(&local_518);
        }
        this_local = (cmComputeLinkInformation *)&ppVar6->second;
        langFeature.Value._4_4_ = 1;
        std::
        vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)(local_300 + 0x10));
      }
      else {
        pcVar2 = this->CMakeInstance;
        psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
        cmStrCat<char_const(&)[10],std::__cxx11::string_const&,char_const(&)[75],std::__cxx11::string_const&,char_const(&)[28],std::__cxx11::string&,char_const(&)[17]>
                  ((string *)(local_208 + 0x10),(char (*) [10])"Feature \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   iVar3._M_node,
                   (char (*) [75])
                   "\', specified through generator-expression \'$<LINK_GROUP>\' to link target \'",
                   psVar5,(char (*) [28])"\', is not defined for the \'",&this->LinkLanguage,
                   (char (*) [17])"\' link language.");
        cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_208);
        cmake::IssueMessage(pcVar2,FATAL_ERROR,(string *)(local_208 + 0x10),
                            (cmListFileBacktrace *)local_208);
        cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_208);
        std::__cxx11::string::~string((string *)(local_208 + 0x10));
        iVar3 = it;
        local_238 = 0;
        aStack_230._M_allocated_capacity = 0;
        aStack_250._8_8_ = 0;
        p_Stack_240 = (_Base_ptr)0x0;
        local_258 = (_Base_ptr)0x0;
        aStack_250._M_allocated_capacity = 0;
        aStack_270._8_8_ = 0;
        p_Stack_260 = (_Base_ptr)0x0;
        local_278 = (_Base_ptr)0x0;
        aStack_270._M_allocated_capacity = 0;
        aStack_290._8_8_ = 0;
        p_Stack_280 = (_Base_ptr)0x0;
        local_298 = 0;
        aStack_290._M_allocated_capacity = 0;
        local_2c8._32_8_ = (_Base_ptr)0x0;
        local_2c8._40_8_ = (_Base_ptr)0x0;
        local_2c8._16_8_ = 0;
        local_2c8._24_8_ = 0;
        local_2c8._0_8_ = 0;
        local_2c8._8_8_ = 0;
        aStack_230._8_8_ = 0;
        FeatureDescriptor::FeatureDescriptor((FeatureDescriptor *)local_2c8);
        pVar9 = std::
                map<std::__cxx11::string,cmComputeLinkInformation::FeatureDescriptor,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
                ::emplace<std::__cxx11::string_const&,cmComputeLinkInformation::FeatureDescriptor>
                          ((map<std::__cxx11::string,cmComputeLinkInformation::FeatureDescriptor,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
                            *)&this->GroupFeatureDescriptors,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           iVar3._M_node,(FeatureDescriptor *)local_2c8);
        items.
        super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pVar9.first._M_node;
        local_210[0] = pVar9.second;
        local_218._M_node =
             (_Base_ptr)
             items.
             super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        ppVar6 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>
                 ::operator->(&local_218);
        this_local = (cmComputeLinkInformation *)&ppVar6->second;
        FeatureDescriptor::~FeatureDescriptor((FeatureDescriptor *)local_2c8);
        langFeature.Value._4_4_ = 1;
      }
    }
    else {
      pcVar2 = this->CMakeInstance;
      psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
      cmStrCat<char_const(&)[10],std::__cxx11::string_const&,char_const(&)[75],std::__cxx11::string_const&,char_const(&)[30],std::__cxx11::string&,char_const(&)[17]>
                ((string *)(local_100 + 0x10),(char (*) [10])"Feature \'",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)iVar3._M_node,
                 (char (*) [75])
                 "\', specified through generator-expression \'$<LINK_GROUP>\' to link target \'",
                 psVar5,(char (*) [30])"\', is not supported for the \'",&this->LinkLanguage,
                 (char (*) [17])"\' link language.");
      cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_100);
      cmake::IssueMessage(pcVar2,FATAL_ERROR,(string *)(local_100 + 0x10),
                          (cmListFileBacktrace *)local_100);
      cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_100);
      std::__cxx11::string::~string((string *)(local_100 + 0x10));
      iVar3 = it;
      local_128 = (_Base_ptr)0x0;
      aStack_120._M_allocated_capacity = 0;
      aStack_140._8_8_ = 0;
      p_Stack_130 = (_Base_ptr)0x0;
      local_148 = (_Base_ptr)0x0;
      aStack_140._M_allocated_capacity = 0;
      local_158._0_8_ = 0;
      local_158._8_8_ = (_Base_ptr)0x0;
      local_168._0_8_ = 0;
      local_168._8_8_ = 0;
      aStack_180._8_8_ = 0;
      sStack_170 = 0;
      local_188 = (_Base_ptr)0x0;
      aStack_180._M_allocated_capacity = 0;
      local_198 = (_Base_ptr)0x0;
      p_Stack_190 = (_Base_ptr)0x0;
      local_1a8._M_allocated_capacity = 0;
      local_1a8._8_8_ = 0;
      local_1b8 = (_Base_ptr)0x0;
      p_Stack_1b0 = (_Base_ptr)0x0;
      aStack_120._8_8_ = 0;
      FeatureDescriptor::FeatureDescriptor((FeatureDescriptor *)&local_1b8);
      pVar9 = std::
              map<std::__cxx11::string,cmComputeLinkInformation::FeatureDescriptor,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
              ::emplace<std::__cxx11::string_const&,cmComputeLinkInformation::FeatureDescriptor>
                        ((map<std::__cxx11::string,cmComputeLinkInformation::FeatureDescriptor,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
                          *)&this->GroupFeatureDescriptors,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         iVar3._M_node,(FeatureDescriptor *)&local_1b8);
      local_110 = pVar9.first._M_node;
      local_108[0] = pVar9.second;
      ppVar6 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>
               ::operator->(&local_110);
      this_local = (cmComputeLinkInformation *)&ppVar6->second;
      FeatureDescriptor::~FeatureDescriptor((FeatureDescriptor *)&local_1b8);
      langFeature.Value._4_4_ = 1;
    }
    std::__cxx11::string::~string((string *)&featureSupported);
  }
  return (FeatureDescriptor *)this_local;
}

Assistant:

cmComputeLinkInformation::FeatureDescriptor const&
cmComputeLinkInformation::GetGroupFeature(std::string const& feature)
{
  auto it = this->GroupFeatureDescriptors.find(feature);
  if (it != this->GroupFeatureDescriptors.end()) {
    return it->second;
  }

  auto featureName =
    cmStrCat("CMAKE_", this->LinkLanguage, "_LINK_GROUP_USING_", feature);
  cmValue featureSupported =
    this->Makefile->GetDefinition(cmStrCat(featureName, "_SUPPORTED"));
  if (!featureSupported) {
    // language specific variable is not defined, fallback to the more generic
    // one
    featureName = cmStrCat("CMAKE_LINK_GROUP_USING_", feature);
    featureSupported =
      this->Makefile->GetDefinition(cmStrCat(featureName, "_SUPPORTED"));
  }
  if (!featureSupported.IsOn()) {
    this->CMakeInstance->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat("Feature '", feature,
               "', specified through generator-expression '$<LINK_GROUP>' to "
               "link target '",
               this->Target->GetName(), "', is not supported for the '",
               this->LinkLanguage, "' link language."),
      this->Target->GetBacktrace());
    return this->GroupFeatureDescriptors.emplace(feature, FeatureDescriptor{})
      .first->second;
  }

  cmValue langFeature = this->Makefile->GetDefinition(featureName);
  if (!langFeature) {
    this->CMakeInstance->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat("Feature '", feature,
               "', specified through generator-expression '$<LINK_GROUP>' to "
               "link target '",
               this->Target->GetName(), "', is not defined for the '",
               this->LinkLanguage, "' link language."),
      this->Target->GetBacktrace());
    return this->GroupFeatureDescriptors.emplace(feature, FeatureDescriptor{})
      .first->second;
  }

  auto items = cmExpandListWithBacktrace(
    *langFeature, this->Target->GetBacktrace(), cmList::EmptyElements::Yes);

  // replace LINKER: pattern
  this->Target->ResolveLinkerWrapper(items, this->LinkLanguage, true);

  if (items.size() == 2) {
    return this->GroupFeatureDescriptors
      .emplace(
        feature,
        GroupFeatureDescriptor{ feature, items[0].Value, items[1].Value })
      .first->second;
  }

  this->CMakeInstance->IssueMessage(
    MessageType::FATAL_ERROR,
    cmStrCat("Feature '", feature, "', specified by variable '", featureName,
             "', is malformed (wrong number of elements) and cannot be used "
             "to link target '",
             this->Target->GetName(), "'."),
    this->Target->GetBacktrace());
  return this->GroupFeatureDescriptors.emplace(feature, FeatureDescriptor{})
    .first->second;
}